

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_defer_clear_queue(void)

{
  fio_defer_clear_tasks_for_queue(&task_queue_normal);
  fio_defer_clear_tasks_for_queue(&task_queue_urgent);
  return;
}

Assistant:

void fio_defer_clear_queue(void) { fio_defer_clear_tasks(); }